

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  void *pvVar4;
  exception *e;
  Column local_d0;
  undefined1 local_b8 [8];
  Statement query;
  int nb;
  undefined1 local_38 [8];
  Database db;
  
  db._36_4_ = 0;
  poVar2 = std::operator<<((ostream *)&std::cout,"SQlite3 version ");
  poVar2 = std::operator<<(poVar2,"3.39.3");
  poVar2 = std::operator<<(poVar2," (");
  pcVar3 = SQLite::getLibVersion();
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2,")");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"SQliteC++ version ");
  poVar2 = std::operator<<(poVar2,"3.02.00");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  SQLite::Database::Database((Database *)local_38,"test.db3",6,0,(char *)0x0);
  poVar2 = std::operator<<((ostream *)&std::cout,"SQLite database file \'");
  SQLite::Database::getFilename_abi_cxx11_((Database *)local_38);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::operator<<(poVar2,"\' opened successfully\n");
  SQLite::Database::exec((Database *)local_38,"DROP TABLE IF EXISTS test");
  SQLite::Database::exec
            ((Database *)local_38,"CREATE TABLE test (id INTEGER PRIMARY KEY, value TEXT)");
  query.mColumnNames._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
       SQLite::Database::exec((Database *)local_38,"INSERT INTO test VALUES (NULL, \"test\")");
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "INSERT INTO test VALUES (NULL, \"test\")\", returned ");
  pvVar4 = (void *)std::ostream::operator<<
                             (poVar2,(int)query.mColumnNames._M_t._M_impl.super__Rb_tree_header.
                                          _M_node_count);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  query.mColumnNames._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
       SQLite::Database::exec((Database *)local_38,"INSERT INTO test VALUES (NULL, \"second\")");
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "INSERT INTO test VALUES (NULL, \"second\")\", returned ");
  pvVar4 = (void *)std::ostream::operator<<
                             (poVar2,(int)query.mColumnNames._M_t._M_impl.super__Rb_tree_header.
                                          _M_node_count);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  query.mColumnNames._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
       SQLite::Database::exec
                 ((Database *)local_38,"UPDATE test SET value=\"second-updated\" WHERE id=\'2\'");
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "UPDATE test SET value=\"second-updated\" WHERE id=\'2\', returned ");
  pvVar4 = (void *)std::ostream::operator<<
                             (poVar2,(int)query.mColumnNames._M_t._M_impl.super__Rb_tree_header.
                                          _M_node_count);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  SQLite::Statement::Statement((Statement *)local_b8,(Database *)local_38,"SELECT * FROM test");
  std::operator<<((ostream *)&std::cout,"SELECT * FROM test :\n");
  while( true ) {
    bVar1 = SQLite::Statement::executeStep((Statement *)local_b8);
    if (!bVar1) break;
    poVar2 = std::operator<<((ostream *)&std::cout,"row (");
    SQLite::Statement::getColumn(&local_d0,(Statement *)local_b8,0);
    poVar2 = SQLite::operator<<(poVar2,&local_d0);
    poVar2 = std::operator<<(poVar2,", \"");
    SQLite::Statement::getColumn((Column *)&e,(Statement *)local_b8,1);
    poVar2 = SQLite::operator<<(poVar2,(Column *)&e);
    std::operator<<(poVar2,"\")\n");
    SQLite::Column::~Column((Column *)&e);
    SQLite::Column::~Column(&local_d0);
  }
  SQLite::Database::exec((Database *)local_38,"DROP TABLE test");
  SQLite::Statement::~Statement((Statement *)local_b8);
  SQLite::Database::~Database((Database *)local_38);
  remove("test.db3");
  std::operator<<((ostream *)&std::cout,"everything ok, quitting\n");
  return 0;
}

Assistant:

int main ()
{
    // Using SQLITE_VERSION would require #include <sqlite3.h> which we want to avoid: use SQLite::VERSION if possible.
//  std::cout << "SQlite3 version " << SQLITE_VERSION << std::endl;
    std::cout << "SQlite3 version " << SQLite::VERSION << " (" << SQLite::getLibVersion() << ")" << std::endl;
    std::cout << "SQliteC++ version " << SQLITECPP_VERSION << std::endl;

    ////////////////////////////////////////////////////////////////////////////
    // Simple batch queries example :
    try
    {
        // Open a database file in create/write mode
        SQLite::Database    db("test.db3", SQLite::OPEN_READWRITE|SQLite::OPEN_CREATE);
        std::cout << "SQLite database file '" << db.getFilename().c_str() << "' opened successfully\n";

        // Create a new table with an explicit "id" column aliasing the underlying rowid
        db.exec("DROP TABLE IF EXISTS test");
        db.exec("CREATE TABLE test (id INTEGER PRIMARY KEY, value TEXT)");

        // first row
        int nb = db.exec("INSERT INTO test VALUES (NULL, \"test\")");
        std::cout << "INSERT INTO test VALUES (NULL, \"test\")\", returned " << nb << std::endl;

        // second row
        nb = db.exec("INSERT INTO test VALUES (NULL, \"second\")");
        std::cout << "INSERT INTO test VALUES (NULL, \"second\")\", returned " << nb << std::endl;

        // update the second row
        nb = db.exec("UPDATE test SET value=\"second-updated\" WHERE id='2'");
        std::cout << "UPDATE test SET value=\"second-updated\" WHERE id='2', returned " << nb << std::endl;

        // Check the results : expect two row of result
        SQLite::Statement   query(db, "SELECT * FROM test");
        std::cout << "SELECT * FROM test :\n";
        while (query.executeStep())
        {
            std::cout << "row (" << query.getColumn(0) << ", \"" << query.getColumn(1) << "\")\n";
        }

        db.exec("DROP TABLE test");
    }
    catch (std::exception& e)
    {
        std::cout << "SQLite exception: " << e.what() << std::endl;
        return EXIT_FAILURE; // unexpected error : exit the example program
    }
    remove("test.db3");

    std::cout << "everything ok, quitting\n";

    return EXIT_SUCCESS;
}